

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_t unaff_R13;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i match;
  long local_90;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_int_&>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  sVar6 = 0xffffffffffffffff;
  if (*(long *)this != 0) {
    uVar2 = *(ulong *)(this + 0x18);
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar9 = hashval >> 7 & uVar2;
    auVar12 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar12 = pshuflw(auVar12,auVar12,0);
    local_48 = auVar12._0_4_;
    local_90 = 0;
    uStack_44 = local_48;
    uStack_40 = local_48;
    uStack_3c = local_48;
    do {
      pcVar1 = (char *)(*(long *)this + uVar9);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      cStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      cStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      cStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      cStack_49 = pcVar1[0xf];
      auVar12[0] = -((char)local_48 == local_58);
      auVar12[1] = -(local_48._1_1_ == cStack_57);
      auVar12[2] = -(local_48._2_1_ == cStack_56);
      auVar12[3] = -(local_48._3_1_ == cStack_55);
      auVar12[4] = -((char)uStack_44 == cStack_54);
      auVar12[5] = -(uStack_44._1_1_ == cStack_53);
      auVar12[6] = -(uStack_44._2_1_ == cStack_52);
      auVar12[7] = -(uStack_44._3_1_ == cStack_51);
      auVar12[8] = -((char)uStack_40 == cStack_50);
      auVar12[9] = -(uStack_40._1_1_ == cStack_4f);
      auVar12[10] = -(uStack_40._2_1_ == cStack_4e);
      auVar12[0xb] = -(uStack_40._3_1_ == cStack_4d);
      auVar12[0xc] = -((char)uStack_3c == cStack_4c);
      auVar12[0xd] = -(uStack_3c._1_1_ == cStack_4b);
      auVar12[0xe] = -(uStack_3c._2_1_ == cStack_4a);
      auVar12[0xf] = -(uStack_3c._3_1_ == cStack_49);
      uVar4 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf;
      iVar7 = 4;
      bVar11 = uVar4 == 0;
      sVar6 = unaff_R13;
      if (!bVar11) {
        uVar8 = (uint)uVar4;
        uVar3 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        lVar10 = *(long *)(this + 8);
        while( true ) {
          sVar6 = uVar3 + uVar9 & uVar2;
          local_68.first.
          super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          .
          super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
          ._M_head_impl =
               (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                )(lVar10 + sVar6 * 0x28);
          local_68.second.super__Tuple_impl<0UL,_const_int_&>.
          super__Head_base<0UL,_const_int_&,_false>._M_head_impl =
               (_Tuple_impl<0UL,_const_int_&>)(lVar10 + sVar6 * 0x28 + 0x20);
          local_78.rhs = key;
          local_78.eq = (key_equal *)(this + 0x30);
          bVar5 = memory_internal::
                  DecomposePairImpl<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<int_const&>>
                            (&local_78,&local_68);
          if (bVar5) break;
          uVar8 = uVar8 - 1 & uVar8;
          bVar11 = uVar8 == 0;
          if (bVar11) {
            iVar7 = 4;
            sVar6 = unaff_R13;
            goto LAB_0017522c;
          }
          uVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          lVar10 = *(long *)(this + 8);
        }
        iVar7 = 1;
      }
LAB_0017522c:
      if (bVar11) {
        auVar13[0] = -(local_58 == -0x80);
        auVar13[1] = -(cStack_57 == -0x80);
        auVar13[2] = -(cStack_56 == -0x80);
        auVar13[3] = -(cStack_55 == -0x80);
        auVar13[4] = -(cStack_54 == -0x80);
        auVar13[5] = -(cStack_53 == -0x80);
        auVar13[6] = -(cStack_52 == -0x80);
        auVar13[7] = -(cStack_51 == -0x80);
        auVar13[8] = -(cStack_50 == -0x80);
        auVar13[9] = -(cStack_4f == -0x80);
        auVar13[10] = -(cStack_4e == -0x80);
        auVar13[0xb] = -(cStack_4d == -0x80);
        auVar13[0xc] = -(cStack_4c == -0x80);
        auVar13[0xd] = -(cStack_4b == -0x80);
        auVar13[0xe] = -(cStack_4a == -0x80);
        auVar13[0xf] = -(cStack_49 == -0x80);
        iVar7 = 3;
        if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar13 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar13 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar13 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar13 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar13 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar13 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar13 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar13 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar13 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar13 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar13 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]
           ) {
          lVar10 = uVar9 + local_90;
          local_90 = local_90 + 0x10;
          uVar9 = lVar10 + 0x10U & uVar2;
          iVar7 = 0;
        }
      }
      unaff_R13 = sVar6;
    } while (iVar7 == 0);
    if (iVar7 == 3) {
      sVar6 = 0xffffffffffffffff;
    }
  }
  return sVar6;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }